

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

bool __thiscall google::protobuf::MapKey::GetBoolValue(MapKey *this)

{
  CppType CVar1;
  LogMessage *other;
  byte *in_RDI;
  char *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined8 in_stack_ffffffffffffff68;
  LogLevel_conflict level;
  LogMessage *in_stack_ffffffffffffff70;
  MapKey *in_stack_ffffffffffffffc0;
  
  level = (LogLevel_conflict)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  CVar1 = type(in_stack_ffffffffffffffc0);
  if (CVar1 != CPPTYPE_BOOL) {
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff70,level,
               (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    FieldDescriptor::CppTypeName(CPPTYPE_BOOL);
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    CVar1 = type(in_stack_ffffffffffffffc0);
    FieldDescriptor::CppTypeName(CVar1);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)CONCAT44(CVar1,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff58);
    internal::LogFinisher::operator=((LogFinisher *)CONCAT44(CVar1,in_stack_ffffffffffffff60),other)
    ;
    internal::LogMessage::~LogMessage((LogMessage *)0x41c39e);
  }
  return (bool)(*in_RDI & 1);
}

Assistant:

bool GetBoolValue() const {
    TYPE_CHECK(FieldDescriptor::CPPTYPE_BOOL, "MapKey::GetBoolValue");
    return val_.bool_value_;
  }